

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::SwitchMixin<(unsigned_char)'\b'>::AddCase
          (SwitchMixin<(unsigned_char)__b_> *this,char16 c,Label targetLabel)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  SwitchCase *pSVar6;
  byte bVar7;
  byte bVar8;
  
  if (7 < this->numCases) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x38c,"(numCases < MaxCases)","numCases < MaxCases");
    if (!bVar3) {
LAB_00efdded:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (this->numCases == '\0') {
    bVar8 = 0;
  }
  else {
    pSVar6 = this->cases;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    bVar8 = 0;
    do {
      if (pSVar6->c == c) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0x390,"(cases[i].c != c)","cases[i].c != c");
        if (!bVar3) goto LAB_00efdded;
        *puVar4 = 0;
      }
      if ((ushort)c < (ushort)pSVar6->c) break;
      bVar8 = bVar8 + 1;
      pSVar6 = pSVar6 + 1;
    } while (bVar8 < this->numCases);
  }
  bVar1 = this->numCases;
  if (bVar8 < bVar1) {
    uVar5 = (ulong)bVar1 + 0xffffffff;
    pSVar6 = this->cases + bVar1;
    bVar7 = bVar1;
    do {
      *(undefined2 *)((long)&pSVar6->targetLabel + 2) =
           *(undefined2 *)((long)&this->cases[uVar5 & 0xffffffff].targetLabel + 2);
      *(undefined4 *)pSVar6 = *(undefined4 *)(this->cases + (uVar5 & 0xffffffff));
      uVar5 = uVar5 - 1;
      pSVar6 = pSVar6 + -1;
      bVar7 = bVar7 - 1;
    } while (bVar8 < bVar7);
  }
  this->cases[bVar8].c = c;
  this->cases[bVar8].targetLabel = targetLabel;
  this->numCases = bVar1 + 1;
  return;
}

Assistant:

void SwitchMixin<n>::AddCase(char16 c, Label targetLabel)
    {
        AnalysisAssert(numCases < MaxCases);
        uint8 i;
        for (i = 0; i < numCases; i++)
        {
            Assert(cases[i].c != c);
            if (cases[i].c > c)
            {
                break;
            }
        }
        __analysis_assume(numCases < MaxCases);
        for (uint8 j = numCases; j > i; j--)
        {
            cases[j] = cases[j - 1];
        }
        cases[i].c = c;
        cases[i].targetLabel = targetLabel;
        numCases++;
    }